

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

Node * __thiscall
p2t::Sweep::NewFrontTriangle(Sweep *this,SweepContext *tcx,Point *point,Node *node)

{
  pointer *pppNVar1;
  iterator __position;
  bool bVar2;
  Triangle *this_00;
  Node *new_node;
  Node *local_30;
  
  this_00 = (Triangle *)operator_new(0x40);
  Triangle::Triangle(this_00,point,node->point,node->next->point);
  Triangle::MarkNeighbor(this_00,node->triangle);
  SweepContext::AddToMap(tcx,this_00);
  local_30 = (Node *)operator_new(0x28);
  local_30->point = point;
  local_30->triangle = (Triangle *)0x0;
  local_30->next = (Node *)0x0;
  local_30->prev = (Node *)0x0;
  local_30->value = point->x;
  __position._M_current =
       (this->nodes_).super__Vector_base<p2t::Node_*,_std::allocator<p2t::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->nodes_).super__Vector_base<p2t::Node_*,_std::allocator<p2t::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<p2t::Node*,std::allocator<p2t::Node*>>::_M_realloc_insert<p2t::Node*const&>
              ((vector<p2t::Node*,std::allocator<p2t::Node*>> *)this,__position,&local_30);
  }
  else {
    *__position._M_current = local_30;
    pppNVar1 = &(this->nodes_).super__Vector_base<p2t::Node_*,_std::allocator<p2t::Node_*>_>._M_impl
                .super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  local_30->next = node->next;
  local_30->prev = node;
  node->next->prev = local_30;
  node->next = local_30;
  bVar2 = Legalize(this,tcx,this_00);
  if (!bVar2) {
    SweepContext::MapTriangleToNodes(tcx,this_00);
  }
  return local_30;
}

Assistant:

Node& Sweep::NewFrontTriangle(SweepContext& tcx, Point& point, Node& node)
{
  Triangle* triangle = new Triangle(point, *node.point, *node.next->point);

  triangle->MarkNeighbor(*node.triangle);
  tcx.AddToMap(triangle);

  Node* new_node = new Node(point);
  nodes_.push_back(new_node);

  new_node->next = node.next;
  new_node->prev = &node;
  node.next->prev = new_node;
  node.next = new_node;

  if (!Legalize(tcx, *triangle)) {
    tcx.MapTriangleToNodes(*triangle);
  }

  return *new_node;
}